

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DGXMLScanner::scanAttrListforNameSpaces
          (DGXMLScanner *this,RefVectorOf<xercesc_4_0::XMLAttr> *theAttrList,XMLSize_t attCount,
          XMLElementDecl *elemDecl)

{
  ValueVectorOf<xercesc_4_0::XMLAttr_*> *this_00;
  XMLCh *pXVar1;
  bool bVar2;
  uint uriId;
  XMLAttr **ppXVar3;
  XMLAttr *pXVar4;
  XMLCh *pXVar5;
  XMLAttr *pXVar6;
  XMLSize_t attrIndex;
  XMLSize_t getAt;
  XMLSize_t i;
  ulong uVar7;
  bool toUseHashTable;
  bool local_41;
  XMLElementDecl *local_40;
  XMLSize_t local_38;
  
  local_40 = elemDecl;
  local_38 = attCount;
  for (uVar7 = 0; this_00 = this->fAttrNSList, uVar7 < this_00->fCurCount; uVar7 = uVar7 + 1) {
    ppXVar3 = ValueVectorOf<xercesc_4_0::XMLAttr_*>::elementAt(this_00,uVar7);
    pXVar4 = *ppXVar3;
    uriId = XMLScanner::resolvePrefix
                      (&this->super_XMLScanner,pXVar4->fAttName->fPrefix,Mode_Attribute);
    XMLAttr::setURIId(pXVar4,uriId);
  }
  this_00->fCurCount = 0;
  local_41 = false;
  XMLScanner::setAttrDupChkRegistry(&this->super_XMLScanner,&local_38,&local_41);
  for (uVar7 = 0; uVar7 < local_38; uVar7 = uVar7 + 1) {
    pXVar4 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                       (&theAttrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,uVar7);
    if (local_41 == false) {
      for (getAt = 0; uVar7 != getAt; getAt = getAt + 1) {
        pXVar6 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                           (&theAttrList->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
        if (pXVar6->fAttName->fURIId == pXVar4->fAttName->fURIId) {
          bVar2 = XMLString::equals(pXVar6->fAttName->fLocalPart,pXVar4->fAttName->fLocalPart);
          if (bVar2) {
            pXVar1 = pXVar4->fAttName->fLocalPart;
            pXVar5 = XMLElementDecl::getFullName(local_40);
            XMLScanner::emitError
                      (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar1,pXVar5,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
        }
      }
    }
    else {
      bVar2 = RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::containsKey
                        ((this->super_XMLScanner).fAttrDupChkRegistry,pXVar4->fAttName->fLocalPart,
                         pXVar4->fAttName->fURIId);
      if (bVar2) {
        pXVar1 = pXVar4->fAttName->fLocalPart;
        pXVar5 = XMLElementDecl::getFullName(local_40);
        XMLScanner::emitError
                  (&this->super_XMLScanner,AttrAlreadyUsedInSTag,pXVar1,pXVar5,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      RefHash2KeysTableOf<xercesc_4_0::XMLAttr,_xercesc_4_0::StringHasher>::put
                ((this->super_XMLScanner).fAttrDupChkRegistry,pXVar4->fAttName->fLocalPart,
                 pXVar4->fAttName->fURIId,pXVar4);
    }
  }
  return;
}

Assistant:

void DGXMLScanner::scanAttrListforNameSpaces(RefVectorOf<XMLAttr>* theAttrList, XMLSize_t attCount,
                                                XMLElementDecl*       elemDecl)
{
    // Map prefixes to uris
    for (XMLSize_t i=0; i < fAttrNSList->size(); i++) {
        XMLAttr* providedAttr = fAttrNSList->elementAt(i);
        providedAttr->setURIId(
            resolvePrefix(providedAttr->getPrefix(), ElemStack::Mode_Attribute)
        );
    }

    fAttrNSList->removeAllElements();

     // Decide if to use hash table to do duplicate checking
    bool toUseHashTable = false;

	setAttrDupChkRegistry(attCount, toUseHashTable);
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // check for duplicate namespace attributes:
        // by checking for qualified names with the same local part and with prefixes
        // which have been bound to namespace names that are identical.
        XMLAttr* curAttr = theAttrList->elementAt(index);
        if (!toUseHashTable)
        {
            XMLAttr* loopAttr;
            for (XMLSize_t attrIndex=0; attrIndex < index; attrIndex++) {
                loopAttr = theAttrList->elementAt(attrIndex);
                if (loopAttr->getURIId() == curAttr->getURIId() &&
                    XMLString::equals(loopAttr->getName(), curAttr->getName())) {
                    emitError(
                        XMLErrs::AttrAlreadyUsedInSTag, curAttr->getName()
                        , elemDecl->getFullName()
                    );
                }
            }
        }
        else
        {
            if (fAttrDupChkRegistry->containsKey((void*)curAttr->getName(), curAttr->getURIId()))
            {
                emitError(
                    XMLErrs::AttrAlreadyUsedInSTag
                    , curAttr->getName(), elemDecl->getFullName()
                );
            }

            fAttrDupChkRegistry->put((void*)curAttr->getName(), curAttr->getURIId(), curAttr);
        }
    }
}